

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O0

bool __thiscall QToolBarPrivate::mouseMoveEvent(QToolBarPrivate *this,QMouseEvent *event)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  QMainWindow *pQVar7;
  QMainWindowLayout *pQVar8;
  QWidget *pQVar9;
  QToolBarPrivate *in_RDI;
  long in_FS_OFFSET;
  QWindow *handle;
  int pos_1;
  bool moving;
  bool wasDragging;
  QMainWindowLayout *layout;
  QMainWindow *win;
  QToolBar *q;
  QPoint delta;
  QPoint globalPressPos;
  QPoint rtl;
  QPoint pos;
  int in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  QWindow *local_1b8;
  DragState *context;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  QToolBarPrivate *in_stack_fffffffffffffe60;
  bool local_121;
  QPoint *in_stack_ffffffffffffff28;
  QLayoutItem *in_stack_ffffffffffffff30;
  QPoint in_stack_ffffffffffffff38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if (in_RDI->state == (DragState *)0x0) {
    local_121 = false;
  }
  else {
    pQVar7 = qobject_cast<QMainWindow*>((QObject *)0x6eba93);
    if (pQVar7 == (QMainWindow *)0x0) {
      local_121 = true;
    }
    else {
      pQVar8 = qt_mainwindow_layout((QMainWindow *)0x6ebac0);
      bVar4 = false;
      if (pQVar8->pluggingWidget == (QWidget *)0x0) {
        QSinglePointEvent::position((QSinglePointEvent *)0x6ebaed);
        QPointF::toPoint((QPointF *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        ::operator-((QPoint *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                    (QPoint *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        iVar5 = QPoint::manhattanLength
                          ((QPoint *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        iVar6 = QApplication::startDragDistance();
        bVar4 = iVar6 < iVar5;
      }
      if (bVar4) {
        bVar4 = in_RDI->state->dragging;
        bVar3 = QWidget::isWindow((QWidget *)
                                  CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        bVar2 = false;
        if (!bVar3) {
          if (in_RDI->orientation == Vertical) {
            QSinglePointEvent::position((QSinglePointEvent *)0x6ebbbf);
            QPointF::toPoint((QPointF *)
                             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
            iVar5 = QPoint::x((QPoint *)0x6ebbf3);
            bVar2 = false;
            if (-1 < iVar5) {
              QSinglePointEvent::position((QSinglePointEvent *)0x6ebc0d);
              QPointF::toPoint((QPointF *)
                               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
              iVar5 = QPoint::x((QPoint *)0x6ebc41);
              iVar6 = QWidget::width((QWidget *)0x6ebc52);
              bVar2 = iVar5 < iVar6;
            }
          }
          else {
            QSinglePointEvent::position((QSinglePointEvent *)0x6ebc7b);
            QPointF::toPoint((QPointF *)
                             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
            iVar5 = QPoint::y((QPoint *)0x6ebcaf);
            bVar2 = false;
            if (-1 < iVar5) {
              QSinglePointEvent::position((QSinglePointEvent *)0x6ebcc9);
              QPointF::toPoint((QPointF *)
                               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
              iVar5 = QPoint::y((QPoint *)0x6ebcfd);
              iVar6 = QWidget::height((QWidget *)0x6ebd0e);
              bVar2 = iVar5 < iVar6;
            }
          }
        }
        startDrag(in_stack_fffffffffffffe60,SUB41((uint)in_stack_fffffffffffffe5c >> 0x18,0));
        if ((!bVar2) && ((bVar4 & 1U) == 0)) {
          QWidget::grabMouse((QWidget *)0x6ebd71);
        }
      }
      if (in_RDI->state == (DragState *)0x0) {
        QWidget::releaseMouse((QWidget *)0x6ebd8f);
        local_121 = true;
      }
      else {
        if ((in_RDI->state->dragging & 1U) == 0) {
          if ((in_RDI->state->moving & 1U) != 0) {
            iVar5 = QWidget::width((QWidget *)0x6ebf45);
            iVar6 = QPoint::x((QPoint *)0x6ebf5c);
            iVar6 = iVar5 - iVar6;
            QPoint::y((QPoint *)0x6ebf79);
            QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                           in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28);
            bVar4 = QWidget::isRightToLeft((QWidget *)0x6ebfb5);
            if (bVar4) {
              context = (DragState *)&stack0xffffffffffffff38;
            }
            else {
              context = in_RDI->state;
            }
            QWidget::mapToGlobal
                      ((QWidget *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       (QPoint *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
            pQVar9 = QWidget::window((QWidget *)
                                     CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
            if (pQVar9 == (QWidget *)0x0) {
              local_1b8 = (QWindow *)0x0;
            }
            else {
              QWidget::window((QWidget *)
                              CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
              local_1b8 = QWidget::windowHandle
                                    ((QWidget *)
                                     CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
            }
            if (local_1b8 == (QWindow *)0x0) {
              QSinglePointEvent::globalPosition((QSinglePointEvent *)0x6ec0f8);
              QPointF::toPoint((QPointF *)
                               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
              ::operator-((QPoint *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                          (QPoint *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
            }
            else {
              QSinglePointEvent::globalPosition((QSinglePointEvent *)0x6ec067);
              QHighDpi::fromNativePixels<QPointF,QWindow>
                        ((QPointF *)CONCAT44(iVar6,iVar5),(QWindow *)context);
              QPointF::toPoint((QPointF *)
                               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
              QHighDpi::fromNativePixels<QPoint,QWindow>
                        ((QPoint *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                         (QWindow *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
              ::operator-((QPoint *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                          (QPoint *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
            }
            if (in_RDI->orientation == Vertical) {
              in_stack_fffffffffffffe44 =
                   QWidget::y((QWidget *)
                              CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
              QPoint::y((QPoint *)0x6ec168);
            }
            else {
              bVar4 = QWidget::isRightToLeft((QWidget *)0x6ec189);
              if (bVar4) {
                in_stack_fffffffffffffe38 = QWidget::width((QWidget *)0x6ec19c);
                in_stack_fffffffffffffe3c = QWidget::width((QWidget *)0x6ec1ad);
                in_stack_fffffffffffffe3c = in_stack_fffffffffffffe38 - in_stack_fffffffffffffe3c;
                in_stack_fffffffffffffe40 =
                     QWidget::x((QWidget *)
                                CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
                in_stack_fffffffffffffe40 = in_stack_fffffffffffffe3c - in_stack_fffffffffffffe40;
                QPoint::x((QPoint *)0x6ec1df);
              }
              else {
                in_stack_fffffffffffffe34 =
                     QWidget::x((QWidget *)
                                CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
                QPoint::x((QPoint *)0x6ec20e);
              }
            }
            QMainWindowLayout::moveToolBar
                      ((QMainWindowLayout *)
                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       (QToolBar *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       in_stack_fffffffffffffe34);
          }
        }
        else {
          QSinglePointEvent::globalPosition((QSinglePointEvent *)0x6ebdce);
          QPointF::toPoint((QPointF *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40))
          ;
          bVar4 = QWidget::isLeftToRight((QWidget *)0x6ebe02);
          if (bVar4) {
            QPoint::operator-=((QPoint *)
                               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                               (QPoint *)
                               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
          }
          else {
            QPoint::x((QPoint *)0x6ebe34);
            QWidget::width((QWidget *)0x6ebe45);
            QPoint::y((QPoint *)0x6ebe62);
            QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                           in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28);
            QPoint::operator+=((QPoint *)
                               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                               (QPoint *)
                               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
          }
          QWidget::move((QWidget *)in_stack_fffffffffffffe60,
                        (QPoint *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          QSinglePointEvent::globalPosition((QSinglePointEvent *)0x6ebed0);
          QPointF::toPoint((QPointF *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40))
          ;
          QMainWindowLayout::hover
                    ((QMainWindowLayout *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                     in_stack_ffffffffffffff28);
        }
        local_121 = true;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_121;
}

Assistant:

bool QToolBarPrivate::mouseMoveEvent(QMouseEvent *event)
{
    Q_Q(QToolBar);

    if (!state) {
#ifdef Q_OS_MACOS
        if (!macWindowDragging)
            return false;
        QWidget *w = q->window();
        const QPoint delta = event->pos() - macWindowDragPressPosition;
        w->move(w->pos() + delta);
        return true;
#endif
        return false;
    }

    QMainWindow *win = qobject_cast<QMainWindow*>(parent);
    if (win == nullptr)
        return true;

    QMainWindowLayout *layout = qt_mainwindow_layout(win);
    Q_ASSERT(layout != nullptr);

    if (layout->pluggingWidget == nullptr
        && (event->position().toPoint() - state->pressPos).manhattanLength() > QApplication::startDragDistance()) {
            const bool wasDragging = state->dragging;
            const bool moving = !q->isWindow() && (orientation == Qt::Vertical ?
                event->position().toPoint().x() >= 0 && event->position().toPoint().x() < q->width() :
                event->position().toPoint().y() >= 0 && event->position().toPoint().y() < q->height());

            startDrag(moving);
            if (!moving && !wasDragging)
                q->grabMouse();
    }

    if (!state) {
        q->releaseMouse();
        return true;
    }

    if (state->dragging) {
        QPoint pos = event->globalPosition().toPoint();
        // if we are right-to-left, we move so as to keep the right edge the same distance
        // from the mouse
        if (q->isLeftToRight())
            pos -= state->pressPos;
        else
            pos += QPoint(state->pressPos.x() - q->width(), -state->pressPos.y());

        q->move(pos);
        layout->hover(state->widgetItem, event->globalPosition().toPoint());
    } else if (state->moving) {

        const QPoint rtl(q->width() - state->pressPos.x(), state->pressPos.y()); //for RTL
        const QPoint globalPressPos = q->mapToGlobal(q->isRightToLeft() ? rtl : state->pressPos);
        int pos = 0;

        const QWindow *handle = q->window() ? q->window()->windowHandle() : nullptr;
        const QPoint delta = handle
                ? QHighDpi::fromNativePixels(event->globalPosition(), handle).toPoint()
                  - QHighDpi::fromNativePixels(globalPressPos, handle)
                : event->globalPosition().toPoint() - globalPressPos;

        if (orientation == Qt::Vertical) {
            pos = q->y() + delta.y();
        } else {
            if (q->isRightToLeft()) {
                pos = win->width() - q->width() - q->x()  - delta.x();
            } else {
                pos = q->x() + delta.x();
            }
        }

        layout->moveToolBar(q, pos);
    }
    return true;
}